

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O2

void verifyProcrustes<float>
               (vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *from,
               vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *to)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  undefined8 uVar4;
  Vec3<float> *pVVar5;
  Vec3<float> *pVVar6;
  pointer pVVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  pointer pfVar12;
  int i_2;
  size_type __n;
  double (*padVar13) [3];
  int i_1;
  long lVar14;
  size_t i;
  long lVar15;
  ulong uVar16;
  Vec3 *pVVar17;
  double (*padVar18) [4];
  size_t iPoint;
  size_type sVar19;
  Vec3 *pVVar20;
  double (*xform) [4];
  bool bVar21;
  uint uVar22;
  float fVar23;
  float fVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  double local_498;
  undefined8 uStack_490;
  vector<float,_std::allocator<float>_> weights;
  double local_470;
  undefined1 local_458 [26];
  Rand48 rand;
  undefined1 local_430 [8];
  undefined1 local_428 [16];
  Euler<double> local_418;
  double local_3f0;
  Vec3<float> local_3e8;
  M44d translateMatrix;
  M44d ms;
  Matrix44<double> local_2c8;
  M44d m;
  M33d upperLeft;
  M44d m1;
  M33d product;
  M44d m2;
  
  __n = ((long)(from->
               super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>)
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(from->
              super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start) / 0xc;
  std::vector<float,_std::allocator<float>_>::vector(&weights,__n,(allocator_type *)&m1);
  for (lVar15 = 0;
      (long)weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start >> 2 != lVar15; lVar15 = lVar15 + 1) {
    weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar15] = 1.0;
  }
  pVVar17 = (Vec3 *)&m1;
  bVar21 = SUB81(__n,0);
  Imath_3_2::procrustesRotationAndTranslation<float>
            (pVVar17,(Vec3 *)(from->
                             super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                             )._M_impl.super__Vector_impl_data._M_start,
             (ulong)(to->
                    super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                    )._M_impl.super__Vector_impl_data._M_start,bVar21);
  pVVar20 = (Vec3 *)&m2;
  Imath_3_2::procrustesRotationAndTranslation<float>
            (pVVar20,(Vec3 *)(from->
                             super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                             )._M_impl.super__Vector_impl_data._M_start,
             &((to->
               super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>)
               ._M_impl.super__Vector_impl_data._M_start)->x,
             (ulong)weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,bVar21);
  for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
    lVar14 = 0;
    while (lVar14 != 4) {
      lVar1 = lVar14 * 8;
      lVar2 = lVar14 * 8;
      lVar14 = lVar14 + 1;
      if (0.0003452669770922512 <= ABS(*(double *)(pVVar17 + lVar1) - *(double *)(pVVar20 + lVar2)))
      {
        __assert_fail("std::abs (m1[i][j] - m2[i][j]) < eps",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                      ,0x9f,
                      "void verifyProcrustes(const std::vector<Imath_3_2::Vec3<T>> &, const std::vector<Imath_3_2::Vec3<T>> &) [T = float]"
                     );
      }
    }
    pVVar20 = pVVar20 + 0x20;
    pVVar17 = pVVar17 + 0x20;
  }
  for (uVar16 = 1;
      uVar16 - ((long)weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) != 1; uVar16 = uVar16 + 1) {
    weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar16 - 1] = (float)uVar16;
  }
  Imath_3_2::procrustesRotationAndTranslation<float>
            ((Vec3 *)&m,
             (Vec3 *)(from->
                     super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
             &((to->
               super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>)
               ._M_impl.super__Vector_impl_data._M_start)->x,
             (ulong)weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,bVar21);
  pVVar17 = (Vec3 *)&ms;
  Imath_3_2::procrustesRotationAndTranslation<float>
            (pVVar17,(Vec3 *)(from->
                             super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                             )._M_impl.super__Vector_impl_data._M_start,
             &((to->
               super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>)
               ._M_impl.super__Vector_impl_data._M_start)->x,
             (ulong)weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,bVar21);
  padVar18 = (double (*) [4])&m;
  dVar8 = Imath_3_2::Matrix44<double>::determinant((Matrix44<double> *)padVar18);
  if (0.00034526698 <= ABS((float)dVar8 + -1.0)) {
    __assert_fail("std::abs (det - T (1)) < eps",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                  ,0xae,
                  "void verifyProcrustes(const std::vector<Imath_3_2::Vec3<T>> &, const std::vector<Imath_3_2::Vec3<T>> &) [T = float]"
                 );
  }
  padVar13 = (double (*) [3])&upperLeft;
  upperLeft.x[0][0] = 1.0;
  upperLeft.x[0][1] = 0.0;
  upperLeft.x[0][2] = 0.0;
  upperLeft.x[1][0] = 0.0;
  upperLeft.x[1][1] = 1.0;
  upperLeft.x[2][1] = 0.0;
  upperLeft.x[1][2] = 0.0;
  upperLeft.x[2][0] = 0.0;
  upperLeft.x[2][2] = 1.0;
  for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
    for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
      (*(double (*) [3])*padVar13)[lVar14] = (*(double (*) [4])*padVar18)[lVar14];
    }
    padVar13 = padVar13 + 1;
    padVar18 = padVar18 + 1;
  }
  translateMatrix.x[0][0] = upperLeft.x[0][0];
  translateMatrix.x[0][1] = upperLeft.x[1][0];
  translateMatrix.x[0][2] = upperLeft.x[2][0];
  translateMatrix.x[0][3] = upperLeft.x[0][1];
  translateMatrix.x[1][0] = upperLeft.x[1][1];
  translateMatrix.x[1][1] = upperLeft.x[2][1];
  translateMatrix.x[1][2] = upperLeft.x[0][2];
  translateMatrix.x[1][3] = upperLeft.x[1][2];
  translateMatrix.x[2][0] = upperLeft.x[2][2];
  padVar13 = (double (*) [3])&product;
  Imath_3_2::Matrix33<double>::operator*(&upperLeft,(Matrix33<double> *)&translateMatrix);
  for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
    lVar14 = 0;
    while (lVar14 != 3) {
      uVar22 = 0x3ff00000;
      if (lVar15 != lVar14) {
        uVar22 = 0;
      }
      pdVar3 = *(double (*) [3])*padVar13 + lVar14;
      lVar14 = lVar14 + 1;
      if (0.0003452669770922512 <= ABS(*pdVar3 - (double)((ulong)uVar22 << 0x20))) {
        __assert_fail("std::abs (product[i][j] - expected) < eps",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                      ,0xbc,
                      "void verifyProcrustes(const std::vector<Imath_3_2::Vec3<T>> &, const std::vector<Imath_3_2::Vec3<T>> &) [T = float]"
                     );
      }
    }
    padVar13 = padVar13 + 1;
  }
  rand._state[0] = 0x52fa;
  rand._state[1] = 0x1027;
  rand._state[2] = 0x52fa;
  lVar15 = 10;
  padVar18 = (double (*) [4])&translateMatrix;
  while( true ) {
    bVar21 = lVar15 == 0;
    lVar15 = lVar15 + -1;
    if (bVar21) break;
    dVar8 = (double)Imath_3_2::erand48(rand._state);
    local_458._0_8_ = Imath_3_2::erand48(rand._state);
    dVar10 = (double)Imath_3_2::erand48(rand._state);
    auVar9._8_4_ = SUB84(dVar10 * 0.001,0);
    auVar9._0_8_ = (double)local_458._0_8_ * 0.001;
    auVar9._12_4_ = (int)((ulong)(dVar10 * 0.001) >> 0x20);
    Imath_3_2::Euler<double>::setOrder(&local_418,Default);
    pfVar12 = weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_458._8_8_ = auVar9._8_8_;
    local_418.super_Vec3<double>.z = (double)local_458._8_8_;
    pVVar5 = (from->
             super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pVVar6 = (to->
             super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    local_418.super_Vec3<double>.x = dVar8 * 0.001;
    local_418.super_Vec3<double>.y = (double)local_458._0_8_ * 0.001;
    Imath_3_2::Euler<double>::toMatrix44(&local_2c8,&local_418);
    Imath_3_2::Matrix44<double>::multiply(&m,&local_2c8);
    dVar8 = procrustesError<float>(pVVar5,pVVar6,pfVar12,__n,(M44d *)padVar18);
    dVar10 = procrustesError<float>
                       ((from->
                        super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,
                        (to->
                        super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,
                        weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,__n,&m);
    if (dVar8 <= dVar10) {
      __assert_fail("procrustesError ( &from[0], &to[0], &weights[0], n, m * diffRot.toMatrix44 ()) > procrustesError (&from[0], &to[0], &weights[0], n, m)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                    ,0xcf,
                    "void verifyProcrustes(const std::vector<Imath_3_2::Vec3<T>> &, const std::vector<Imath_3_2::Vec3<T>> &) [T = float]"
                   );
    }
    dVar8 = (double)Imath_3_2::erand48(rand._state);
    local_458._0_8_ = Imath_3_2::erand48(rand._state);
    dVar10 = (double)Imath_3_2::erand48(rand._state);
    local_428._8_4_ = SUB84(dVar10 * 0.001,0);
    local_428._0_8_ = (double)local_458._0_8_ * 0.001;
    local_428._12_4_ = (int)((ulong)(dVar10 * 0.001) >> 0x20);
    translateMatrix.x[0][0] = 1.0;
    translateMatrix.x[0][3] = 0.0;
    translateMatrix.x[1][0] = 0.0;
    translateMatrix.x[0][1] = 0.0;
    translateMatrix.x[0][2] = 0.0;
    translateMatrix.x[1][1] = 1.0;
    translateMatrix.x[2][0] = 0.0;
    translateMatrix.x[2][1] = 0.0;
    translateMatrix.x[1][2] = 0.0;
    translateMatrix.x[1][3] = 0.0;
    translateMatrix.x[2][2] = 1.0;
    translateMatrix.x[3][1] = 0.0;
    translateMatrix.x[3][2] = 0.0;
    translateMatrix.x[2][3] = 0.0;
    translateMatrix.x[3][0] = 0.0;
    translateMatrix.x[3][3] = 1.0;
    local_430 = (undefined1  [8])(dVar8 * 0.001);
    Imath_3_2::Matrix44<double>::translate<double>
              ((Matrix44<double> *)padVar18,(Vec3<double> *)local_430);
    pfVar12 = weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar5 = (from->
             super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pVVar6 = (to->
             super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    Imath_3_2::Matrix44<double>::multiply(&m,(Matrix44<double> *)padVar18);
    dVar8 = procrustesError<float>(pVVar5,pVVar6,pfVar12,__n,&local_2c8);
    dVar10 = procrustesError<float>
                       ((from->
                        super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,
                        (to->
                        super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,
                        weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,__n,&m);
    if (dVar8 <= dVar10) {
      __assert_fail("procrustesError ( &from[0], &to[0], &weights[0], n, m * translateMatrix) > procrustesError (&from[0], &to[0], &weights[0], n, m)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                    ,0xdb,
                    "void verifyProcrustes(const std::vector<Imath_3_2::Vec3<T>> &, const std::vector<Imath_3_2::Vec3<T>> &) [T = float]"
                   );
    }
  }
  translateMatrix.x[0][0] = ms.x[0][0];
  translateMatrix.x[0][1] = ms.x[0][1];
  translateMatrix.x[0][2] = ms.x[0][2];
  translateMatrix.x[0][3] = ms.x[0][3];
  translateMatrix.x[1][0] = ms.x[1][0];
  translateMatrix.x[1][1] = ms.x[1][1];
  translateMatrix.x[1][2] = ms.x[1][2];
  translateMatrix.x[1][3] = ms.x[1][3];
  translateMatrix.x[2][0] = ms.x[2][0];
  translateMatrix.x[2][1] = ms.x[2][1];
  translateMatrix.x[2][2] = ms.x[2][2];
  translateMatrix.x[2][3] = ms.x[2][3];
  translateMatrix.x[3][0] = ms.x[3][0];
  translateMatrix.x[3][1] = ms.x[3][1];
  translateMatrix.x[3][2] = ms.x[3][2];
  translateMatrix.x[3][3] = ms.x[3][3];
  for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
    for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
      (*(double (*) [4])*padVar18)[lVar14] = *(double *)(pVVar17 + lVar14 * 8) * 1.001;
    }
    padVar18 = padVar18 + 1;
    pVVar17 = pVVar17 + 0x20;
  }
  padVar18 = (double (*) [4])&translateMatrix;
  dVar8 = procrustesError<float>
                    ((from->
                     super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (to->
                     super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,__n,(M44d *)padVar18);
  xform = (double (*) [4])&ms;
  dVar10 = procrustesError<float>
                     ((from->
                      super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,
                      (to->
                      super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,
                      weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,__n,(M44d *)xform);
  if (dVar8 <= dVar10) {
    __assert_fail("procrustesError (&from[0], &to[0], &weights[0], n, newMat) > procrustesError (&from[0], &to[0], &weights[0], n, ms)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                  ,0xe6,
                  "void verifyProcrustes(const std::vector<Imath_3_2::Vec3<T>> &, const std::vector<Imath_3_2::Vec3<T>> &) [T = float]"
                 );
  }
  for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
    for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
      (*(double (*) [4])*padVar18)[lVar14] = (*(double (*) [4])*xform)[lVar14] * 0.999;
    }
    padVar18 = padVar18 + 1;
    xform = xform + 1;
  }
  dVar8 = procrustesError<float>
                    ((from->
                     super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (to->
                     super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,__n,&translateMatrix);
  dVar10 = procrustesError<float>
                     ((from->
                      super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,
                      (to->
                      super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,
                      weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,__n,&ms);
  if (dVar10 < dVar8) {
    local_2c8.x[0]._0_16_ = ZEXT816(0);
    local_2c8.x[0][2] = 0.0;
    local_458._0_16_ = ZEXT816(0);
    local_418.super_Vec3<double>.x = 0.0;
    local_418.super_Vec3<double>.y = 0.0;
    local_418.super_Vec3<double>.z = 0.0;
    lVar15 = 0;
    local_470 = 0.0;
    sVar19 = 0;
    while( true ) {
      dVar8 = local_418.super_Vec3<double>.x;
      if (__n == sVar19) break;
      fVar24 = weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[sVar19];
      uStack_490._0_4_ = SUB84(local_418.super_Vec3<double>.y,0);
      local_498 = local_418.super_Vec3<double>.x;
      uStack_490._4_4_ = (int)((ulong)local_418.super_Vec3<double>.y >> 0x20);
      local_3f0 = local_418.super_Vec3<double>.z;
      Imath_3_2::operator*
                ((Vec3<float> *)
                 ((long)&((from->
                          super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->x + lVar15),&m);
      pVVar7 = (to->
               super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      local_3e8.z = ((float)local_428._0_4_ - *(float *)((long)&pVVar7->z + lVar15)) * fVar24;
      local_470 = local_470 + (double)local_3e8.z;
      uVar4 = *(undefined8 *)((long)&pVVar7->x + lVar15);
      fVar23 = fVar24 * (local_430._0_4_ - (float)uVar4);
      fVar24 = fVar24 * (local_430._4_4_ - (float)((ulong)uVar4 >> 0x20));
      local_3e8.y = fVar24;
      local_3e8.x = fVar23;
      dVar10 = (double)local_458._0_8_ + (double)fVar23;
      dVar11 = (double)local_458._8_8_ + (double)fVar24;
      uVar25 = SUB84(dVar11,0);
      uVar26 = (undefined4)((ulong)dVar11 >> 0x20);
      local_458._8_4_ = uVar25;
      local_458._0_8_ = dVar10;
      local_458._12_4_ = uVar26;
      local_2c8.x[0][1]._0_4_ = uVar25;
      local_2c8.x[0][0] = dVar10;
      local_2c8.x[0][1]._4_4_ = uVar26;
      local_2c8.x[0][2] = local_470;
      Imath_3_2::Vec3<float>::cross((Vec3<float> *)((long)&pVVar7->x + lVar15),&local_3e8);
      local_418.super_Vec3<double>.z = local_3f0 + (double)(float)local_428._0_4_;
      local_418.super_Vec3<double>.x = dVar8 + (double)local_430._0_4_;
      local_418.super_Vec3<double>.y = uStack_490 + (double)local_430._4_4_;
      sVar19 = sVar19 + 1;
      lVar15 = lVar15 + 0xc;
    }
    dVar8 = Imath_3_2::Vec3<double>::length2((Vec3<double> *)&local_2c8);
    if (dVar8 < 0.0003452669770922512) {
      dVar8 = Imath_3_2::Vec3<double>::length2(&local_418.super_Vec3<double>);
      if (dVar8 < 0.0003452669770922512) {
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&weights.super__Vector_base<float,_std::allocator<float>_>);
        return;
      }
      __assert_fail("netTorque.length2 () < eps",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                    ,0x101,
                    "void verifyProcrustes(const std::vector<Imath_3_2::Vec3<T>> &, const std::vector<Imath_3_2::Vec3<T>> &) [T = float]"
                   );
    }
    __assert_fail("netForce.length2 () < eps",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                  ,0x100,
                  "void verifyProcrustes(const std::vector<Imath_3_2::Vec3<T>> &, const std::vector<Imath_3_2::Vec3<T>> &) [T = float]"
                 );
  }
  __assert_fail("procrustesError (&from[0], &to[0], &weights[0], n, newMat) > procrustesError (&from[0], &to[0], &weights[0], n, ms)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                ,0xed,
                "void verifyProcrustes(const std::vector<Imath_3_2::Vec3<T>> &, const std::vector<Imath_3_2::Vec3<T>> &) [T = float]"
               );
}

Assistant:

void
verifyProcrustes (
    const std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T>>& from,
    const std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T>>& to)
{
    const T eps = std::sqrt (std::numeric_limits<T>::epsilon ());

    const size_t n = from.size ();

    // Validate that passing in uniform weights gives the same answer as
    // passing in no weights:
    std::vector<T> weights (from.size ());
    for (size_t i = 0; i < weights.size (); ++i)
        weights[i] = 1;
    IMATH_INTERNAL_NAMESPACE::M44d m1 =
        procrustesRotationAndTranslation (&from[0], &to[0], n);
    IMATH_INTERNAL_NAMESPACE::M44d m2 =
        procrustesRotationAndTranslation (&from[0], &to[0], &weights[0], n);
    for (int i = 0; i < 4; ++i)
        for (int j = 0; j < 4; ++j)
            assert (std::abs (m1[i][j] - m2[i][j]) < eps);

    // Now try the weighted version:
    for (size_t i = 0; i < weights.size (); ++i)
        weights[i] = static_cast<T>(i + 1);

    IMATH_INTERNAL_NAMESPACE::M44d m =
        procrustesRotationAndTranslation (&from[0], &to[0], &weights[0], n);

    // with scale:
    IMATH_INTERNAL_NAMESPACE::M44d ms = procrustesRotationAndTranslation (
        &from[0], &to[0], &weights[0], n, true);

    // Verify that it's orthonormal w/ positive determinant.
    const T det = static_cast<T>(m.determinant ());
    assert (std::abs (det - T (1)) < eps);

    // Verify orthonormal:
    IMATH_INTERNAL_NAMESPACE::M33d upperLeft;
    for (int i = 0; i < 3; ++i)
        for (int j = 0; j < 3; ++j)
            upperLeft[i][j] = m[i][j];
    IMATH_INTERNAL_NAMESPACE::M33d product =
        upperLeft * upperLeft.transposed ();
    for (int i = 0; i < 3; ++i)
    {
        for (int j = 0; j < 3; ++j)
        {
            const double expected = (i == j ? 1.0 : 0.0);
            assert (std::abs (product[i][j] - expected) < eps);
        }
    }

    // Verify that nearby transforms are worse:
    const size_t                     numTries = 10;
    IMATH_INTERNAL_NAMESPACE::Rand48 rand (1056);
    const double                     delta = 1e-3;
    for (size_t i = 0; i < numTries; ++i)
    {
        // Construct an orthogonal rotation matrix using Euler angles:
        IMATH_INTERNAL_NAMESPACE::Eulerd diffRot (
            delta * rand.nextf (),
            delta * rand.nextf (),
            delta * rand.nextf ());

        assert (
            procrustesError (
                &from[0], &to[0], &weights[0], n, m * diffRot.toMatrix44 ()) >
            procrustesError (&from[0], &to[0], &weights[0], n, m));

        // Try a small translation:
        IMATH_INTERNAL_NAMESPACE::V3d diffTrans (
            delta * rand.nextf (),
            delta * rand.nextf (),
            delta * rand.nextf ());
        IMATH_INTERNAL_NAMESPACE::M44d translateMatrix;
        translateMatrix.translate (diffTrans);
        assert (
            procrustesError (
                &from[0], &to[0], &weights[0], n, m * translateMatrix) >
            procrustesError (&from[0], &to[0], &weights[0], n, m));
    }

    // Try a small scale:
    IMATH_INTERNAL_NAMESPACE::M44d newMat    = ms;
    const double                   scaleDiff = delta;
    for (int i = 0; i < 3; ++i)
        for (int j = 0; j < 3; ++j)
            newMat[i][j] = ms[i][j] * (1.0 + scaleDiff);
    assert (
        procrustesError (&from[0], &to[0], &weights[0], n, newMat) >
        procrustesError (&from[0], &to[0], &weights[0], n, ms));

    for (int i = 0; i < 3; ++i)
        for (int j = 0; j < 3; ++j)
            newMat[i][j] = ms[i][j] * (1.0 - scaleDiff);
    assert (
        procrustesError (&from[0], &to[0], &weights[0], n, newMat) >
        procrustesError (&from[0], &to[0], &weights[0], n, ms));

    //
    // Verify the magical property that makes shape springs work:
    // when the displacements Q*A-B, times the weights,
    // are applied as forces at B,
    // there is zero net force and zero net torque.
    //
    {
        IMATH_INTERNAL_NAMESPACE::V3d netForce (0);
        IMATH_INTERNAL_NAMESPACE::V3d netTorque (0);
        for (size_t iPoint = 0; iPoint < n; ++iPoint)
        {
            const IMATH_INTERNAL_NAMESPACE::V3d force =
                weights[iPoint] * (from[iPoint] * m - to[iPoint]);
            netForce += force;
            netTorque += to[iPoint].cross (force);
        }

        assert (netForce.length2 () < eps);
        assert (netTorque.length2 () < eps);
    }
}